

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_device_id id)

{
  char *fmt;
  cl_int ret_00;
  char *pcVar1;
  cl_device_id in_RDI;
  cl_int ret;
  
  ret_00 = (*pReleaseDevice)(in_RDI);
  fmt = kErrorTemplate;
  if (ret_00 != 0) {
    pcVar1 = OclError::toString(ret_00);
    Log::print(ERR,fmt,pcVar1,kReleaseDevice);
  }
  return ret_00;
}

Assistant:

cl_int xmrig::OclLib::release(cl_device_id id) noexcept
{
    assert(pReleaseDevice != nullptr);

    LOG_REFS("%p %u ~device", id, getUint(id, CL_DEVICE_REFERENCE_COUNT));

    const cl_int ret = pReleaseDevice(id);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseDevice);
    }

    return ret;
}